

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

void __thiscall
GameEngine::calculateCell
          (GameEngine *this,size_t posX,size_t posY,int32_t carnivore,int32_t herbivore)

{
  CellType *this_00;
  int32_t iVar1;
  shared_ptr<CellType> cell;
  CellType *local_28;
  
  getCell((GameEngine *)&stack0xffffffffffffffd8,(size_t)this,posX);
  this_00 = local_28;
  if (local_28 != (CellType *)0x0) {
    iVar1 = CellType::getCarnivoreCount(local_28);
    CellType::setCarnivoreCount(this_00,iVar1 + carnivore);
    iVar1 = CellType::getHerbivoreCount(local_28);
    CellType::setHerbivoreCount(local_28,iVar1 + herbivore);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe0);
  return;
}

Assistant:

void GameEngine::calculateCell(size_t posX, size_t posY, int32_t carnivore, int32_t herbivore) {
  auto cell = getCell(posX, posY);

  if (cell) {
    cell->setCarnivoreCount(cell->getCarnivoreCount() + carnivore);
    cell->setHerbivoreCount(cell->getHerbivoreCount() + herbivore);
  }
}